

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::SerializeBytes
          (Serializer<(Diligent::SerializerMode)0> *this,VoidPtr pBytes,ConstQual<size_t> *Size,
          size_t Alignment)

{
  ConstQual<size_t> CVar1;
  TEnable<unsigned_int> TVar2;
  char (*in_R8) [8];
  Uint32 Size32;
  string msg;
  ConstQual<unsigned_int> local_44;
  string local_40;
  
  local_44 = 0;
  TVar2 = Serialize<unsigned_int>(this,&local_44);
  if (TVar2) {
    *Size = (ulong)local_44;
    AlignOffset(this,Alignment);
    CVar1 = *Size;
    if (this->m_Ptr + CVar1 <= this->m_End) {
      *pBytes = this->m_Ptr;
      this->m_Ptr = this->m_Ptr + CVar1;
      return true;
    }
    FormatString<char[26],unsigned_long,char[8]>
              (&local_40,(Diligent *)"Note enough data to read ",(char (*) [26])Size,
               (unsigned_long *)0x7e9695,in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SerializeBytes",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x18b);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return false;
}

Assistant:

inline bool Serializer<SerializerMode::Read>::SerializeBytes(VoidPtr pBytes, ConstQual<size_t>& Size, size_t Alignment)
{
    Uint32 Size32 = 0;
    if (!Serialize<Uint32>(Size32))
        return false;

    Size = Size32;

    AlignOffset(Alignment);

    CHECK_REMAINING_SIZE(Size, "Note enough data to read ", Size, " bytes.");

    pBytes = m_Ptr;
    m_Ptr += Size;

    return true;
}